

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgga_c_rscan.c
# Opt level: O0

void func_exc_unpol(xc_func_type *p,size_t ip,double *rho,double *sigma,double *lapl,double *tau,
                   xc_mgga_out_params *out)

{
  double *pdVar1;
  bool bVar2;
  double *in_RCX;
  long lVar3;
  double *in_RDX;
  long in_RSI;
  long *in_RDI;
  double *in_R9;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  long *in_stack_00000008;
  hyb_mgga_xc_gas22_params *params;
  double tzk0;
  double t317;
  double t316;
  double t314;
  double t313;
  double t312;
  double t310;
  double t309;
  double t308;
  double t307;
  double t305;
  double t303;
  double t302;
  double t301;
  double t300;
  double t299;
  double t297;
  double t296;
  double t295;
  double t294;
  double t293;
  double t292;
  double t291;
  double t289;
  double t287;
  double t286;
  double t285;
  double t284;
  double t282;
  double t280;
  double t275;
  double t274;
  double t271;
  double t266;
  double t264;
  double t261;
  double t258;
  double t257;
  double t254;
  double t252;
  double t249;
  double t246;
  double t245;
  double t243;
  double t241;
  double t239;
  double t234;
  double t233;
  double t232;
  double t231;
  double t230;
  double t229;
  double t226;
  double t225;
  double t223;
  double t222;
  double t221;
  double t220;
  double t219;
  double t218;
  double t217;
  double t216;
  double t215;
  double t214;
  double t213;
  double t211;
  double t210;
  double t209;
  double t208;
  double t207;
  double t205;
  double t204;
  double t200;
  double t199;
  double t197;
  double t196;
  double t195;
  double t186;
  double t185;
  double t184;
  double t181;
  double t176;
  double t172;
  double t171;
  double t168;
  double t163;
  double t161;
  double t160;
  double t156;
  double t154;
  double t152;
  double t151;
  double t148;
  double t146;
  double t144;
  double t142;
  double t141;
  double t140;
  double t139;
  double t137;
  double t134;
  double t133;
  double t131;
  double t129;
  double t126;
  double t125;
  double t124;
  double t123;
  double t119;
  double t118;
  double t116;
  double t115;
  double t114;
  double t113;
  double t112;
  double t111;
  double t109;
  double t108;
  double t107;
  double t106;
  double t105;
  double t104;
  double t103;
  double t102;
  double t101;
  double t97;
  double t96;
  double t94;
  double t93;
  double t92;
  double t91;
  double t89;
  double t88;
  double t87;
  double t86;
  double t85;
  double t83;
  double t79;
  double t76;
  double t73;
  double t72;
  double t70;
  double t69;
  double t67;
  double t65;
  double t64;
  double t63;
  double t60;
  double t59;
  double t57;
  double t54;
  double t51;
  double t48;
  double t47;
  double t45;
  double t44;
  double t42;
  double t41;
  double t38;
  double t37;
  double t36;
  double t35;
  double t34;
  double t31;
  double t29;
  double t27;
  double t26;
  double t24;
  double t23;
  double t22;
  double t21;
  double t20;
  double t19;
  double t17;
  double t16;
  double t15;
  double t14;
  double t12;
  double t11;
  double t10;
  double t9;
  double t8;
  double t7;
  double t6;
  double t5;
  double t4;
  double local_678;
  double local_668;
  double local_660;
  double local_650;
  double local_648;
  double local_640;
  double local_638;
  double local_630;
  double local_628;
  double local_620;
  double local_618;
  bool local_609;
  
  pdVar1 = (double *)in_RDI[0x2f];
  dVar4 = (double)(1.0 <= (double)in_RDI[0x31]);
  local_609 = *in_RDX / 2.0 <= (double)in_RDI[0x30] || dVar4 != 0.0;
  dVar5 = (double)local_609;
  dVar6 = cbrt(0.3183098861837907);
  dVar7 = dVar6 * 1.4422495703074083;
  dVar8 = (double)(2.0 <= (double)in_RDI[0x31]);
  local_650 = cbrt((double)in_RDI[0x31]);
  local_678 = local_650 * (double)in_RDI[0x31];
  local_618 = local_678;
  if ((dVar8 == 0.0) && (!NAN(dVar8))) {
    local_618 = 2.5198420997897464;
  }
  dVar9 = cbrt(*in_RDX);
  dVar10 = cbrt(9.0);
  dVar11 = 1.0 / dVar9;
  local_620 = local_650;
  if ((dVar8 == 0.0) && (!NAN(dVar8))) {
    local_620 = 1.2599210498948732;
  }
  local_630 = (dVar10 * dVar10 * dVar6 * dVar6 * (double)in_RDI[4] * 1.4422495703074083 * dVar11 *
              (1.2599210498948732 / local_620)) / 18.0;
  bVar2 = 1.35 <= local_630;
  dVar8 = (double)(1.35 < local_630);
  local_628 = local_630;
  if ((dVar8 == 0.0) && (!NAN(dVar8))) {
    local_628 = 1.35;
  }
  local_628 = local_628 * local_628;
  dVar10 = local_628 * local_628;
  dVar12 = dVar10 * dVar10;
  if ((dVar8 != 0.0) || (NAN(dVar8))) {
    local_630 = 1.35;
  }
  dVar8 = sqrt(3.141592653589793);
  dVar13 = erf((1.0 / local_630) / 2.0);
  dVar14 = exp(-(1.0 / (local_630 * local_630)) / 4.0);
  if (((double)bVar2 != 0.0) || (NAN((double)bVar2))) {
    local_638 = (((((((1.0 / local_628) / 36.0 - (1.0 / dVar10) / 960.0) +
                    (1.0 / (dVar10 * local_628)) / 26880.0) - (1.0 / dVar12) / 829440.0) +
                  ((1.0 / dVar12) / local_628) / 28385280.0) -
                 ((1.0 / dVar12) / dVar10) / 1073479680.0) +
                ((1.0 / dVar12) / (dVar10 * local_628)) / 44590694400.0) -
                (1.0 / (dVar12 * dVar12)) / 2021444812800.0;
  }
  else {
    local_638 = -(local_630 * 2.6666666666666665) *
                (local_630 * 2.0 *
                 (-(local_630 * local_630 * 2.0) * (dVar14 - 1.0) + (dVar14 - 1.5)) + dVar8 * dVar13
                ) + 1.0;
  }
  dVar8 = pdVar1[1];
  dVar10 = *in_RCX;
  dVar13 = *in_RDX * *in_RDX;
  dVar14 = dVar9 * dVar9;
  dVar15 = (1.0 / dVar14) / dVar13;
  dVar16 = dVar15 * 1.5874010519681996;
  dVar15 = *in_RCX * 1.5874010519681996 * dVar15;
  dVar12 = pdVar1[2];
  dVar17 = cbrt(9.869604401089358);
  dVar17 = dVar17 * dVar17 * 3.3019272488946267;
  dVar18 = dVar17 * 0.3;
  dVar19 = *in_R9 * 1.5874010519681996 * ((1.0 / dVar14) / *in_RDX);
  dVar20 = dVar18 - dVar19;
  dVar18 = dVar18 + dVar19;
  if ((dVar5 != 0.0) || (NAN(dVar5))) {
    local_640 = 0.0;
  }
  else {
    local_640 = dVar7 * 2.519842099789747 * 1.2599210498948732 * -0.046875 * local_618 * dVar9 *
                local_638 *
                (dVar12 * dVar20 * (1.0 / dVar18) +
                dVar8 * dVar10 * 0.003840616724010807 * dVar16 *
                (1.0 / (dVar15 * 0.003840616724010807 + 1.0)) + *pdVar1);
  }
  if ((dVar4 != 0.0) || (NAN(dVar4))) {
    local_648 = (double)in_RDI[0x31];
  }
  else {
    local_648 = 1.0;
  }
  if ((dVar4 != 0.0) || (NAN(dVar4))) {
    local_650 = 1.0 / local_650;
  }
  else {
    local_650 = 1.0;
  }
  dVar8 = dVar7 * 2.519842099789747 * dVar11 * 1.2599210498948732 * local_650;
  dVar10 = sqrt(dVar8);
  dVar12 = sqrt(dVar8);
  dVar12 = dVar8 * dVar12;
  dVar6 = dVar6 * dVar6 * 2.080083823051904;
  dVar21 = dVar6 * 1.5874010519681996 * (1.0 / dVar14) * 1.5874010519681996 * local_650 * local_650;
  dVar22 = log(16.081979498692537 /
               (dVar21 * 0.123235 + dVar12 * 0.204775 + dVar10 * 3.79785 + dVar8 * 0.8969) + 1.0);
  dVar22 = (dVar8 * 0.053425 + 1.0) * 0.0621814 * dVar22;
  local_660 = local_678;
  if ((double)in_RDI[0x31] < 0.0) {
    local_660 = 0.0;
  }
  dVar23 = ((local_618 + local_660) - 2.0) * 1.9236610509315362;
  dVar24 = log(32.16395899738507 /
               (dVar21 * 0.1562925 + dVar12 * 0.420775 + dVar10 * 7.05945 + dVar8 * 1.549425) + 1.0)
  ;
  dVar10 = log(29.608749977793437 /
               (dVar21 * 0.1241775 + dVar12 * 0.1100325 + dVar10 * 5.1785 + dVar8 * 0.905775) + 1.0)
  ;
  dVar10 = (dVar8 * 0.0278125 + 1.0) * dVar10;
  if ((dVar5 != 0.0) || (NAN(dVar5))) {
    local_668 = 0.0;
  }
  else {
    local_668 = (local_648 *
                (dVar23 * 0.0197516734986138 * dVar10 +
                dVar23 * (dVar10 * -0.0197516734986138 +
                         (dVar8 * 0.05137 + 1.0) * -0.0310907 * dVar24 + dVar22) + -dVar22)) / 2.0;
  }
  dVar5 = pdVar1[3];
  dVar8 = *in_RCX;
  dVar23 = dVar15 * 0.46914023462026644 + 1.0;
  dVar10 = pdVar1[4];
  dVar12 = pdVar1[5];
  dVar24 = dVar20 * dVar20;
  dVar25 = dVar18 * dVar18;
  dVar21 = pdVar1[6];
  dVar26 = *in_RCX * *in_RCX;
  dVar26 = dVar26 * dVar26 * dVar26;
  dVar22 = dVar13 * dVar13 * dVar13 * dVar13;
  dVar27 = 1.0 / (dVar22 * dVar22);
  dVar28 = dVar23 * dVar23;
  dVar28 = (1.0 / (dVar28 * dVar28)) / dVar28;
  dVar22 = pdVar1[7];
  dVar11 = dVar7 * 2.519842099789747 * dVar11;
  dVar7 = sqrt(dVar11);
  dVar29 = sqrt(dVar11);
  dVar6 = dVar6 * 1.5874010519681996 * (1.0 / dVar14);
  dVar14 = log(16.081979498692537 /
               (dVar6 * 0.123235 + dVar11 * dVar29 * 0.204775 + dVar7 * 3.79785 + dVar11 * 0.8969) +
               1.0);
  if ((dVar4 == 0.0) && (!NAN(dVar4))) {
    local_678 = 1.0;
  }
  dVar29 = log(29.608749977793437 /
               (dVar6 * 0.1241775 + dVar11 * dVar29 * 0.1100325 + dVar7 * 5.1785 + dVar11 * 0.905775
               ) + 1.0);
  dVar4 = pdVar1[9];
  dVar19 = dVar17 * 0.6 * dVar19;
  dVar6 = *in_R9 * *in_R9 * 1.2599210498948732 * 4.0 * ((1.0 / dVar9) / (dVar13 * *in_RDX));
  dVar9 = dVar19 - dVar6;
  dVar9 = dVar9 * dVar9;
  dVar19 = dVar19 + dVar6;
  dVar19 = dVar19 * dVar19;
  dVar6 = pdVar1[10];
  dVar13 = dVar9 * dVar9 * dVar9;
  dVar17 = (1.0 / (dVar19 * dVar19)) / dVar19;
  dVar7 = pdVar1[0xb];
  dVar15 = cbrt(dVar15);
  if ((*in_stack_00000008 != 0) && ((*(uint *)(*in_RDI + 0x40) & 1) != 0)) {
    lVar3 = in_RSI * (int)in_RDI[0xb];
    *(double *)(*in_stack_00000008 + lVar3 * 8) =
         local_640 * 2.0 +
         local_668 * 2.0 *
         (dVar22 * dVar24 * dVar24 * (1.0 / (dVar25 * dVar25)) * 0.17058312527037534 * dVar26 *
          dVar27 * dVar28 +
         dVar21 * dVar26 * 0.17058312527037534 * dVar27 * dVar28 +
         dVar12 * dVar24 * (1.0 / dVar25) +
         dVar5 * dVar8 * 0.46914023462026644 * dVar16 * (1.0 / dVar23) +
         dVar10 * dVar20 * (1.0 / dVar18)) +
         (((dVar11 * 0.053425 + 1.0) * -0.0621814 * dVar14 +
          (local_678 + local_678 + -2.0) * 1.9236610509315362 * 0.0197516734986138 *
          (dVar11 * 0.0278125 + 1.0) * dVar29) - (local_668 + local_668)) *
         (pdVar1[0xc] * dVar9 * (1.0 / dVar19) * dVar15 +
          dVar7 * dVar13 * dVar17 * dVar15 +
          dVar4 * dVar9 * (1.0 / dVar19) + dVar6 * dVar13 * dVar17 + pdVar1[8]) +
         *(double *)(*in_stack_00000008 + lVar3 * 8);
  }
  return;
}

Assistant:

GPU_DEVICE_FUNCTION static inline void
func_exc_unpol(const xc_func_type *p, size_t ip, const double *rho, const double *sigma, const double *lapl, const double *tau, xc_mgga_out_params *out)
{
  double t2, t3, t4, t5, t6, t7, t8, t11;
  double t13, t14, t17, t19, t20, t21, t22, t23;
  double t25, t27, t30, t31, t33, t34, t35, t37;
  double t39, t40, t41, t43, t44, t46, t51, t54;
  double t55, t58, t59, t60, t61, t63, t64, t65;
  double t66, t67, t69, t71, t72, t73, t74, t77;
  double t78, t80, t81, t82, t83, t84, t85, t86;
  double t87, t88, t89, t90, t92, t94, t98, t99;
  double t101, t104, t105, t107, t108, t109, t110, t111;
  double t113, t114, t117, t118, t119, t120, t121, t122;
  double t123, t124, t125, t126, t127, t130, t132, t133;
  double t134, t135, t136, t137, t140, t143, t144, t145;
  double t147, t148, t149, t150, t152, t154, t156, t158;
  double t160, t165, t166, t169, t171, t174, t175, t178;
  double t179, t180, t181, t182, t186, t187, t189, t191;
  double t192, t198, t200, t201, tzk0;


  t2 = M_CBRT3;
  t3 = 0.1e1 / M_PI;
  t4 = POW_1_3(t3);
  t5 = t2 * t4;
  t6 = M_CBRT4;
  t7 = t6 * t6;
  t8 = POW_1_3(rho[0]);
  t11 = t5 * t7 / t8;
  t13 = 0.1e1 + 0.53425e-1 * t11;
  t14 = sqrt(t11);
  t17 = POW_3_2(t11);
  t19 = t2 * t2;
  t20 = t4 * t4;
  t21 = t19 * t20;
  t22 = t8 * t8;
  t23 = 0.1e1 / t22;
  t25 = t21 * t6 * t23;
  t27 = 0.379785e1 * t14 + 0.8969e0 * t11 + 0.204775e0 * t17 + 0.123235e0 * t25;
  t30 = 0.1e1 + 0.16081979498692535067e2 / t27;
  t31 = log(t30);
  t33 = 0.621814e-1 * t13 * t31;
  t34 = 0.1e1 <= p->zeta_threshold;
  t35 = POW_1_3(p->zeta_threshold);
  t37 = my_piecewise3(t34, t35 * p->zeta_threshold, 1);
  t39 = 0.2e1 * t37 - 0.2e1;
  t40 = M_CBRT2;
  t41 = t40 - 0.1e1;
  t43 = 0.1e1 / t41 / 0.2e1;
  t44 = t39 * t43;
  t46 = 0.1e1 + 0.278125e-1 * t11;
  t51 = 0.51785e1 * t14 + 0.905775e0 * t11 + 0.1100325e0 * t17 + 0.1241775e0 * t25;
  t54 = 0.1e1 + 0.29608749977793437516e2 / t51;
  t55 = log(t54);
  t58 = 0.19751673498613801407e-1 * t44 * t46 * t55;
  t59 = log(0.2e1);
  t60 = 0.1e1 - t59;
  t61 = M_PI * M_PI;
  t63 = t60 / t61;
  t64 = t35 * t35;
  t65 = my_piecewise3(t34, t64, 1);
  t66 = t65 * t65;
  t67 = t66 * t65;
  t69 = 0.1e1 + 0.25e-1 * t11;
  t71 = 0.1e1 + 0.4445e-1 * t11;
  t72 = 0.1e1 / t71;
  t73 = t69 * t72;
  t74 = 0.1e1 / t60;
  t77 = 0.1e1 / t67;
  t78 = t61 * t77;
  t80 = exp(-(-t33 + t58) * t74 * t78);
  t81 = t80 - 0.1e1;
  t82 = 0.1e1 / t81;
  t83 = t74 * t82;
  t84 = t83 * sigma[0];
  t85 = t73 * t84;
  t86 = rho[0] * rho[0];
  t87 = t8 * t86;
  t88 = 0.1e1 / t87;
  t89 = t88 * t40;
  t90 = 0.1e1 / t66;
  t92 = 0.1e1 / t4;
  t94 = t19 * t92 * t6;
  t98 = 0.1e1 + 0.27439371595564631661e-1 * t85 * t89 * t90 * t94;
  t99 = POW_1_4(t98);
  t101 = 0.1e1 - 0.1e1 / t99;
  t104 = 0.1e1 + 0.1e1 * t101 * t81;
  t105 = log(t104);
  t107 = t63 * t67 * t105;
  t108 = t86 * t86;
  t109 = t108 * rho[0];
  t110 = t22 * rho[0];
  t111 = 0.1e1 / t110;
  t113 = t22 * t86;
  t114 = 0.1e1 / t113;
  t117 = tau[0] * t111 - sigma[0] * t114 / 0.8e1;
  t118 = 0.e0 < t117;
  t119 = my_piecewise3(t118, t117, 0);
  t120 = t119 * t119;
  t121 = t120 * t119;
  t122 = t109 * t121;
  t123 = M_CBRT6;
  t124 = t123 * t123;
  t125 = POW_1_3(t61);
  t126 = t125 * t125;
  t127 = t124 * t126;
  t130 = t40 * t40;
  t132 = 0.3e1 / 0.1e2 * t127 * t110 + 0.1e-3 * t130;
  t133 = t132 * t132;
  t134 = t133 * t132;
  t135 = 0.1e1 / t134;
  t136 = t86 * rho[0];
  t137 = t8 * t136;
  t140 = 0.1e1 / t133 * t40;
  t143 = 0.2e1 * t137 * t120 * t140 + 0.1e-2;
  t144 = 0.1e1 / t143;
  t145 = t135 * t144;
  t147 = 0.4e1 * t122 * t145;
  t148 = t147 <= 0.25e1;
  t149 = 0.25e1 < t147;
  t150 = my_piecewise3(t149, 0.25e1, t147);
  t152 = t150 * t150;
  t154 = t152 * t150;
  t156 = t152 * t152;
  t158 = t156 * t150;
  t160 = t156 * t152;
  t165 = my_piecewise3(t149, t147, 0.25e1);
  t166 = 0.1e1 - t165;
  t169 = exp(0.15e1 / t166);
  t171 = my_piecewise3(t148, 0.1e1 - 0.64e0 * t150 - 0.4352e0 * t152 - 0.1535685604549e1 * t154 + 0.3061560252175e1 * t156 - 0.1915710236206e1 * t158 + 0.516884468372e0 * t160 - 0.51848879792e-1 * t156 * t154, -0.7e0 * t169);
  t174 = 0.1e1 + 0.4445e-1 * t14 + 0.3138525e-1 * t11;
  t175 = 0.1e1 / t174;
  t178 = exp(0.1e1 * t175);
  t179 = t178 - 0.1e1;
  t180 = 0.1e1 / t126;
  t181 = t123 * t180;
  t182 = t130 * sigma[0];
  t186 = 0.1e1 + 0.21337642104376358333e-1 * t181 * t182 * t114;
  t187 = POW_1_4(t186);
  t189 = 0.1e1 - 0.1e1 / t187;
  t191 = t179 * t189 + 0.1e1;
  t192 = log(t191);
  t198 = 0.1e1 - 0.2363e1 * t41 * t39 * t43;
  t200 = (-0.285764e-1 * t175 + 0.285764e-1 * t192) * t198 + t33 - t58 - t107;
  t201 = t171 * t200;
  tzk0 = -t33 + t58 + t107 + t201;

  if(out->zk != NULL && (p->info->flags & XC_FLAGS_HAVE_EXC))
    out->zk[ip*p->dim.zk + 0] += tzk0;

}